

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O1

void __thiscall
cfd::ConfidentialTransactionContext::SignWithKey
          (ConfidentialTransactionContext *this,OutPoint *outpoint,Pubkey *pubkey,Privkey *privkey,
          SigHashType *sighash_type,bool has_grind_r)

{
  bool bVar1;
  CfdException *this_00;
  SigHashType local_558;
  SigHashType local_54c;
  string local_540;
  UtxoData utxo;
  
  UtxoData::UtxoData(&utxo);
  bVar1 = IsFindUtxoMap(this,outpoint,&utxo);
  if (!bVar1) {
    this_00 = (CfdException *)__cxa_allocate_exception(0x30);
    local_540._M_dataplus._M_p = (pointer)&local_540.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_540,"Utxo is not found. sign fail.","");
    core::CfdException::CfdException(this_00,kCfdIllegalStateError,&local_540);
    __cxa_throw(this_00,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  bVar1 = core::BlindFactor::IsEmpty(&utxo.amount_blind_factor);
  if (bVar1) {
    bVar1 = core::ConfidentialValue::HasBlinding(&utxo.value_commitment);
    if (!bVar1) {
      core::SigHashType::SigHashType(&local_54c,sighash_type);
      SignWithPrivkeySimple
                (this,outpoint,pubkey,privkey,&local_54c,&utxo.amount,utxo.address_type,has_grind_r)
      ;
      goto LAB_003cda1f;
    }
  }
  core::SigHashType::SigHashType(&local_558,sighash_type);
  SignWithPrivkeySimple
            (this,outpoint,pubkey,privkey,&local_558,&utxo.value_commitment,utxo.address_type,
             has_grind_r);
LAB_003cda1f:
  UtxoData::~UtxoData(&utxo);
  return;
}

Assistant:

void ConfidentialTransactionContext::SignWithKey(
    const OutPoint& outpoint, const Pubkey& pubkey, const Privkey& privkey,
    SigHashType sighash_type, bool has_grind_r) {
  UtxoData utxo;
  if (!IsFindUtxoMap(outpoint, &utxo)) {
    throw CfdException(
        CfdError::kCfdIllegalStateError, "Utxo is not found. sign fail.");
  }

  if (utxo.amount_blind_factor.IsEmpty() &&
      (!utxo.value_commitment.HasBlinding())) {
    SignWithPrivkeySimple(
        outpoint, pubkey, privkey, sighash_type, utxo.amount,
        utxo.address_type, has_grind_r);
  } else {
    SignWithPrivkeySimple(
        outpoint, pubkey, privkey, sighash_type, utxo.value_commitment,
        utxo.address_type, has_grind_r);
  }
}